

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O2

void __thiscall brown::Tile::drawrectfill(Tile *this,int x0,int y0,int x1,int y1,uint32_t col)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  if (x0 < 1) {
    x0 = 0;
  }
  if (this->x < x1) {
    x1 = this->x;
  }
  if (x0 < x1) {
    iVar1 = 0;
    if (0 < y0) {
      iVar1 = y0;
    }
    if (this->y < y1) {
      y1 = this->y;
    }
    if (iVar1 < y1) {
      lVar2 = (long)iVar1 * (long)this->p + this->f;
      for (; uVar3 = (ulong)(uint)x0, iVar1 != y1; iVar1 = iVar1 + 1) {
        for (; (uint)x1 != uVar3; uVar3 = uVar3 + 1) {
          *(uint32_t *)(lVar2 + uVar3 * 4) = col;
        }
        lVar2 = lVar2 + this->p;
      }
    }
  }
  return;
}

Assistant:

void Tile::drawrectfill (int x0, int y0, int x1, int y1, std::uint32_t col)
{
    int x, y;
    std::uint32_t *lptr;

    x0 = max(x0,0); x1 = min(x1,this->x); if (x0 >= x1) return;
    y0 = max(y0,0); y1 = min(y1,this->y); if (y0 >= y1) return;
    lptr = (std::uint32_t *)(this->p*y0 + this->f);
    for(y=y0;y<y1;y++,lptr=(std::uint32_t *)(((intptr_t)lptr)+this->p))
        for(x=x0;x<x1;x++) lptr[x] = col;
}